

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2CBus.h
# Opt level: O3

int SetSlaveI2CBus(I2CBUS *pI2CBus,UINT addr,BOOL bTenBit,BOOL bPEC,UINT nbretries,UINT timeout)

{
  int iVar1;
  int iVar2;
  
  pI2CBus->i2c_addr = addr;
  if (pI2CBus->DevType == 1) {
    iVar2 = (pI2CBus->RS232Port).DevType;
    if (3 < iVar2 - 1U) {
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = SetOptionsComputerRS232Port
                        ((pI2CBus->RS232Port).hDev,pI2CBus->BaudRate,pI2CBus->ParityMode,
                         pI2CBus->bCheckParity,pI2CBus->nbDataBits,pI2CBus->StopBitsMode,timeout);
      if (iVar2 != 0) {
        return 1;
      }
      tcflush(*(int *)&(pI2CBus->RS232Port).hDev,2);
    }
  }
  else {
    if (pI2CBus->DevType != 0) {
      return 1;
    }
    iVar2 = *(int *)&pI2CBus->hDev;
    iVar1 = ioctl(iVar2,0x703,(ulong)addr);
    if (iVar1 != 0) {
      return 1;
    }
    ioctl(iVar2,0x704,(ulong)(uint)bTenBit);
    ioctl(iVar2,0x708,(ulong)(uint)bPEC);
    ioctl(iVar2,0x701,(ulong)nbretries);
    ioctl(iVar2,0x702,(ulong)timeout / 10);
  }
  return 0;
}

Assistant:

inline int SetSlaveI2CBus(I2CBUS* pI2CBus, UINT addr, BOOL bTenBit, BOOL bPEC, UINT nbretries, UINT timeout)
{
	pI2CBus->i2c_addr = addr;
	switch (pI2CBus->DevType)
	{
	case LOCAL_TYPE_I2CBUS:
		return SetSlaveComputerI2CBus(pI2CBus->hDev, addr, bTenBit, bPEC, nbretries, timeout);
	case USBISS_TYPE_I2CBUS:
#ifndef NO_TIMEOUT_UPDATE_USBISS_SET_SLAVE_I2CBUS
		if (SetOptionsRS232Port(&pI2CBus->RS232Port, pI2CBus->BaudRate, pI2CBus->ParityMode, pI2CBus->bCheckParity, pI2CBus->nbDataBits, pI2CBus->StopBitsMode, timeout) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_ERROR_I2CBUS(("SetSlaveI2CBus error (%s) : %s"
				"(pI2CBus=%#x, addr=%u, bTenBit=%u, bPEC=%u, nbretries=%u, timeout=%u)\n",
				strtime_m(),
				"SetOptionsComputerRS232Port failed. ",
				pI2CBus, addr, bTenBit, bPEC, nbretries, timeout));
			return EXIT_FAILURE;
		}
#endif // NO_TIMEOUT_UPDATE_USBISS_SET_SLAVE_I2CBUS
		break;
	default:
		PRINT_DEBUG_ERROR_I2CBUS(("SetSlaveI2CBus error (%s) : %s"
			"(pI2CBus=%#x, addr=%u, bTenBit=%u, bPEC=%u, nbretries=%u, timeout=%u)\n",
			strtime_m(),
			"Invalid device type. ",
			pI2CBus, addr, bTenBit, bPEC, nbretries, timeout));
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}